

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O0

void __thiscall util_tests::util_ReplaceAll::test_method(util_ReplaceAll *this)

{
  long in_FS_OFFSET;
  anon_class_8_1_3a1eaf4f test_replaceall;
  string original;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd88;
  string *in_stack_fffffffffffffdc0;
  string *expected;
  string *in_stack_fffffffffffffdc8;
  string *substitute;
  string *in_stack_fffffffffffffdd0;
  string *search;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  allocator<char> local_1e5;
  allocator<char> local_1e4;
  allocator<char> local_1e3;
  allocator<char> local_1e2;
  allocator<char> local_1e1;
  allocator<char> local_1e0;
  undefined1 local_1df;
  undefined1 local_1de;
  undefined1 local_1dd;
  undefined1 local_1dc [2];
  allocator<char> local_1da;
  allocator<char> local_1d9;
  undefined1 *local_1d8;
  allocator<char> local_1c9 [417];
  undefined1 local_28 [32];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,
             (allocator<char> *)in_stack_fffffffffffffdc8);
  std::allocator<char>::~allocator(local_1c9);
  local_1d8 = local_28;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,
             (allocator<char> *)in_stack_fffffffffffffdc8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,
             (allocator<char> *)in_stack_fffffffffffffdc8);
  test_method::anon_class_8_1_3a1eaf4f::operator()
            ((anon_class_8_1_3a1eaf4f *)in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,
             in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  std::__cxx11::string::~string(in_stack_fffffffffffffd88);
  std::allocator<char>::~allocator(&local_1da);
  std::__cxx11::string::~string(in_stack_fffffffffffffd88);
  std::allocator<char>::~allocator(&local_1d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdd8,(char *)in_stack_fffffffffffffdd0,
             (allocator<char> *)in_stack_fffffffffffffdc8);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1dc;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)in_stack_fffffffffffffdd0,(allocator<char> *)in_stack_fffffffffffffdc8)
  ;
  test_method::anon_class_8_1_3a1eaf4f::operator()
            ((anon_class_8_1_3a1eaf4f *)this_00,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8,
             in_stack_fffffffffffffdc0);
  std::__cxx11::string::~string(in_stack_fffffffffffffd88);
  std::allocator<char>::~allocator((allocator<char> *)local_1dc);
  std::__cxx11::string::~string(in_stack_fffffffffffffd88);
  std::allocator<char>::~allocator((allocator<char> *)(local_1dc + 1));
  search = (string *)&local_1dd;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)search,(allocator<char> *)in_stack_fffffffffffffdc8);
  substitute = (string *)&local_1de;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)search,(allocator<char> *)substitute);
  expected = (string *)&local_1df;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)search,(allocator<char> *)substitute);
  test_method::anon_class_8_1_3a1eaf4f::operator()
            ((anon_class_8_1_3a1eaf4f *)this_00,search,substitute,expected);
  std::__cxx11::string::~string(in_stack_fffffffffffffd88);
  std::allocator<char>::~allocator((allocator<char> *)&local_1df);
  std::__cxx11::string::~string(in_stack_fffffffffffffd88);
  std::allocator<char>::~allocator((allocator<char> *)&local_1de);
  std::__cxx11::string::~string(in_stack_fffffffffffffd88);
  std::allocator<char>::~allocator((allocator<char> *)&local_1dd);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)search,(allocator<char> *)substitute);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)search,(allocator<char> *)substitute);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)search,(allocator<char> *)substitute);
  test_method::anon_class_8_1_3a1eaf4f::operator()
            ((anon_class_8_1_3a1eaf4f *)this_00,search,substitute,expected);
  std::__cxx11::string::~string(in_stack_fffffffffffffd88);
  std::allocator<char>::~allocator(&local_1e2);
  std::__cxx11::string::~string(in_stack_fffffffffffffd88);
  std::allocator<char>::~allocator(&local_1e1);
  std::__cxx11::string::~string(in_stack_fffffffffffffd88);
  std::allocator<char>::~allocator(&local_1e0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)search,(allocator<char> *)substitute);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)search,(allocator<char> *)substitute);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)search,(allocator<char> *)substitute);
  test_method::anon_class_8_1_3a1eaf4f::operator()
            ((anon_class_8_1_3a1eaf4f *)this_00,search,substitute,expected);
  std::__cxx11::string::~string(in_stack_fffffffffffffd88);
  std::allocator<char>::~allocator(&local_1e5);
  std::__cxx11::string::~string(in_stack_fffffffffffffd88);
  std::allocator<char>::~allocator(&local_1e4);
  std::__cxx11::string::~string(in_stack_fffffffffffffd88);
  std::allocator<char>::~allocator(&local_1e3);
  std::__cxx11::string::~string(in_stack_fffffffffffffd88);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(util_ReplaceAll)
{
    const std::string original("A test \"%s\" string '%s'.");
    auto test_replaceall = [&original](const std::string& search, const std::string& substitute, const std::string& expected) {
        auto test = original;
        ReplaceAll(test, search, substitute);
        BOOST_CHECK_EQUAL(test, expected);
    };

    test_replaceall("", "foo", original);
    test_replaceall(original, "foo", "foo");
    test_replaceall("%s", "foo", "A test \"foo\" string 'foo'.");
    test_replaceall("\"", "foo", "A test foo%sfoo string '%s'.");
    test_replaceall("'", "foo", "A test \"%s\" string foo%sfoo.");
}